

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

Aig_Man_t * Fra_ClassesDeriveAig(Fra_Cla_t *p,int nFramesK)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *p_00;
  char *pcVar5;
  Aig_Obj_t **ppEquivs_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *__ptr;
  Aig_Obj_t *p1;
  int local_4c;
  int nFramesAll;
  int f;
  int k;
  int i;
  Aig_Obj_t **ppEquivs;
  Aig_Obj_t **pLatches;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pManFraig;
  int nFramesK_local;
  Fra_Cla_t *p_local;
  
  iVar2 = nFramesK + 1;
  iVar3 = Aig_ManRegNum(p->pAig);
  if (iVar3 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x322,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  iVar3 = Aig_ManRegNum(p->pAig);
  iVar4 = Aig_ManCiNum(p->pAig);
  if (iVar4 <= iVar3) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x323,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (nFramesK < 1) {
    __assert_fail("nFramesK > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x324,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  iVar3 = Aig_ManObjNumMax(p->pAig);
  p_00 = Aig_ManStart(iVar3 * iVar2);
  pcVar5 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pAig->pSpec);
  p_00->pSpec = pcVar5;
  iVar3 = Aig_ManObjNumMax(p->pAig);
  ppEquivs_00 = (Aig_Obj_t **)malloc((long)iVar3 << 3);
  pAVar6 = Aig_ManConst1(p->pAig);
  pAVar7 = Aig_ManConst1(p_00);
  Fra_ObjSetEqu(ppEquivs_00,pAVar6,pAVar7);
  iVar3 = Aig_ManCiNum(p->pAig);
  iVar4 = Aig_ManRegNum(p->pAig);
  for (f = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pAig->vCis), f < iVar3; f = f + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
    pAVar7 = Aig_ObjCreateCi(p_00);
    Fra_ObjSetEqu(ppEquivs_00,pAVar6,pAVar7);
  }
  iVar3 = Aig_ManRegNum(p->pAig);
  __ptr = malloc((long)iVar3 << 3);
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    f = 0;
    while( true ) {
      iVar3 = Aig_ManCiNum(p->pAig);
      iVar4 = Aig_ManRegNum(p->pAig);
      if (iVar3 - iVar4 <= f) break;
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
      pAVar7 = Aig_ObjCreateCi(p_00);
      Fra_ObjSetEqu(ppEquivs_00,pAVar6,pAVar7);
      f = f + 1;
    }
    iVar3 = Aig_ManCiNum(p->pAig);
    iVar4 = Aig_ManRegNum(p->pAig);
    for (f = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pAig->vCis), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
      Fra_ClassesDeriveNode(p_00,pAVar6,ppEquivs_00);
    }
    for (f = 0; iVar3 = Vec_PtrSize(p->pAig->vObjs), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,f);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
        pAVar7 = Fra_ObjChild0Equ(ppEquivs_00,pAVar6);
        p1 = Fra_ObjChild1Equ(ppEquivs_00,pAVar6);
        pAVar7 = Aig_And(p_00,pAVar7,p1);
        Fra_ObjSetEqu(ppEquivs_00,pAVar6,pAVar7);
        Fra_ClassesDeriveNode(p_00,pAVar6,ppEquivs_00);
      }
    }
    if (local_4c == nFramesK) break;
    if (local_4c == nFramesK + -1) {
      iVar3 = Aig_ManCoNum(p_00);
      p_00->nAsserts = iVar3;
    }
    nFramesAll = 0;
    iVar3 = Aig_ManCoNum(p->pAig);
    iVar4 = Aig_ManRegNum(p->pAig);
    for (f = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pAig->vCos), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,f);
      pAVar6 = Fra_ObjChild0Equ(ppEquivs_00,pAVar6);
      *(Aig_Obj_t **)((long)__ptr + (long)nFramesAll * 8) = pAVar6;
      nFramesAll = nFramesAll + 1;
    }
    nFramesAll = 0;
    iVar3 = Aig_ManCiNum(p->pAig);
    iVar4 = Aig_ManRegNum(p->pAig);
    for (f = iVar3 - iVar4; iVar3 = Vec_PtrSize(p->pAig->vCis), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
      Fra_ObjSetEqu(ppEquivs_00,pAVar6,*(Aig_Obj_t **)((long)__ptr + (long)nFramesAll * 8));
      nFramesAll = nFramesAll + 1;
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (ppEquivs_00 != (Aig_Obj_t **)0x0) {
    free(ppEquivs_00);
  }
  iVar3 = Aig_ManCoNum(p_00);
  if (iVar3 % iVar2 == 0) {
    uVar1 = p_00->nAsserts;
    iVar2 = Aig_ManCoNum(p_00);
    printf("Assert miters = %6d. Output miters = %6d.\n",(ulong)uVar1,
           (ulong)(uint)(iVar2 - p_00->nAsserts));
    Aig_ManCleanup(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(pManFraig) % nFramesAll == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x350,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
}

Assistant:

Aig_Man_t * Fra_ClassesDeriveAig( Fra_Cla_t * p, int nFramesK )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches, ** ppEquivs;
    int i, k, f, nFramesAll = nFramesK + 1;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    assert( nFramesK > 0 );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // allocate place for the node mapping
    ppEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );
    Fra_ObjSetEqu( ppEquivs, Aig_ManConst1(p->pAig), Aig_ManConst1(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < nFramesAll; f++ )
    {
        // create PIs for this frame
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Equ(ppEquivs, pObj), Fra_ObjChild1Equ(ppEquivs, pObj) );
            Fra_ObjSetEqu( ppEquivs, pObj, pObjNew );
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        }
        if ( f == nFramesAll - 1 )
            break;
        if ( f == nFramesAll - 2 )
            pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Fra_ObjChild0Equ( ppEquivs, pObj );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, pLatches[k++] );
    }
    ABC_FREE( pLatches );
    ABC_FREE( ppEquivs );
    // mark the asserts
    assert( Aig_ManCoNum(pManFraig) % nFramesAll == 0 );
printf( "Assert miters = %6d. Output miters = %6d.\n", 
       pManFraig->nAsserts, Aig_ManCoNum(pManFraig) - pManFraig->nAsserts );
    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    return pManFraig;
}